

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger number_delegate_tochar(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQChar c;
  SQObjectPtr local_20;
  
  pSVar2 = stack_get(v,1);
  if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
    c = (SQChar)(long)(pSVar2->super_SQObject)._unVal.fFloat;
  }
  else {
    c = (SQChar)*(undefined4 *)&(pSVar2->super_SQObject)._unVal;
  }
  local_20.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,&c,1);
  local_20.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  SQVM::Push(v,&local_20);
  SQObjectPtr::~SQObjectPtr(&local_20);
  return 1;
}

Assistant:

static SQInteger number_delegate_tochar(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    SQChar c = (SQChar)tointeger(o);
    v->Push(SQString::Create(_ss(v),(const SQChar *)&c,1));
    return 1;
}